

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

DUMB_RESAMPLER *
dumb_start_resampler_n(int n,void *src,int src_channels,int32 pos,int32 start,int32 end,int quality)

{
  DUMB_RESAMPLER *pDVar1;
  
  if (n == 0x10) {
    pDVar1 = dumb_start_resampler_16((short *)src,src_channels,pos,start,end,quality);
    return pDVar1;
  }
  if (n == 8) {
    pDVar1 = dumb_start_resampler_8((char *)src,src_channels,pos,start,end,quality);
    return pDVar1;
  }
  pDVar1 = dumb_start_resampler((sample_t_conflict *)src,src_channels,pos,start,end,quality);
  return pDVar1;
}

Assistant:

DUMB_RESAMPLER *dumb_start_resampler_n(int n, void *src, int src_channels, int32 pos, int32 start, int32 end, int quality)
{
	if (n == 8)
		return dumb_start_resampler_8(src, src_channels, pos, start, end, quality);
	else if (n == 16)
		return dumb_start_resampler_16(src, src_channels, pos, start, end, quality);
	else
		return dumb_start_resampler(src, src_channels, pos, start, end, quality);
}